

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

int mbedtls_blowfish_crypt_ecb(mbedtls_blowfish_context *ctx,int mode,uchar *input,uchar *output)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint x;
  short i;
  ulong uVar4;
  uint local_38;
  uint local_34;
  
  uVar3 = *(uint *)input;
  uVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)(input + 4);
  local_38 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  local_34 = uVar1;
  if (mode == 0) {
    uVar3 = local_38;
    for (uVar4 = 0x11; 1 < uVar4; uVar4 = uVar4 - 1) {
      x = uVar1 ^ ctx->P[uVar4];
      uVar2 = F(ctx,x);
      uVar1 = uVar2 ^ uVar3;
      uVar3 = x;
    }
    local_38 = uVar1 ^ ctx->P[1];
    local_34 = uVar3 ^ ctx->P[0];
  }
  else {
    blowfish_enc(ctx,&local_34,&local_38);
  }
  *output = (uchar)(local_34 >> 0x18);
  output[1] = (uchar)(local_34 >> 0x10);
  output[2] = (uchar)(local_34 >> 8);
  output[3] = (uchar)local_34;
  output[4] = (uchar)(local_38 >> 0x18);
  output[5] = (uchar)(local_38 >> 0x10);
  output[6] = (uchar)(local_38 >> 8);
  output[7] = (uchar)local_38;
  return 0;
}

Assistant:

int mbedtls_blowfish_crypt_ecb( mbedtls_blowfish_context *ctx,
                    int mode,
                    const unsigned char input[MBEDTLS_BLOWFISH_BLOCKSIZE],
                    unsigned char output[MBEDTLS_BLOWFISH_BLOCKSIZE] )
{
    uint32_t X0, X1;
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( mode == MBEDTLS_BLOWFISH_ENCRYPT ||
                           mode == MBEDTLS_BLOWFISH_DECRYPT );
    BLOWFISH_VALIDATE_RET( input  != NULL );
    BLOWFISH_VALIDATE_RET( output != NULL );

    GET_UINT32_BE( X0, input,  0 );
    GET_UINT32_BE( X1, input,  4 );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        blowfish_dec( ctx, &X0, &X1 );
    }
    else /* MBEDTLS_BLOWFISH_ENCRYPT */
    {
        blowfish_enc( ctx, &X0, &X1 );
    }

    PUT_UINT32_BE( X0, output,  0 );
    PUT_UINT32_BE( X1, output,  4 );

    return( 0 );
}